

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_ARB1_const_array(Context *ctx,ConstantsList *clist,int base,int size)

{
  char *pcVar1;
  long lVar2;
  int leavedecimal;
  char *buf;
  int iVar3;
  char val0 [32];
  char val3 [32];
  char val2 [32];
  char val1 [32];
  char varname [64];
  char local_f8 [32];
  char local_d8 [32];
  char local_b8 [32];
  char local_98 [32];
  char local_78 [72];
  
  snprintf(local_78,0x40,"c_array_%d_%d",base,(ulong)(uint)size);
  push_output(ctx,&ctx->globals);
  buf = (char *)(ulong)(uint)size;
  output_line(ctx,"PARAM %s[%d] = {",local_78);
  ctx->indent = ctx->indent + 1;
  if (0 < size) {
    iVar3 = 0;
    do {
      for (; leavedecimal = (int)buf, (clist->constant).type != MOJOSHADER_UNIFORM_FLOAT;
          clist = clist->next) {
      }
      if ((clist->constant).index != base + iVar3) {
        __assert_fail("clist->constant.index == (base + i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1b99,
                      "void emit_ARB1_const_array(Context *, const ConstantsList *, int, int)");
      }
      floatstr(ctx,local_f8,1,(clist->constant).value.f[0],leavedecimal);
      buf = local_98;
      floatstr(ctx,buf,1,(clist->constant).value.f[1],leavedecimal);
      floatstr(ctx,local_b8,1,(clist->constant).value.f[2],leavedecimal);
      floatstr(ctx,local_d8,1,(clist->constant).value.f[3],leavedecimal);
      pcVar1 = "";
      if (iVar3 < size + -1) {
        pcVar1 = ",";
      }
      output_line(ctx,"{ %s, %s, %s, %s }%s",local_f8,buf,local_b8,local_d8,pcVar1);
      clist = clist->next;
      iVar3 = iVar3 + 1;
    } while (iVar3 != size);
  }
  ctx->indent = ctx->indent + -1;
  output_line(ctx,"};");
  lVar2 = (long)ctx->output_stack_len;
  if (0 < lVar2) {
    ctx->output_stack_len = (int)(lVar2 - 1U);
    ctx->output = ctx->output_stack[lVar2 - 1U & 0xffffffff];
    ctx->indent = ctx->indent_stack[lVar2 + -1];
    return;
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_ARB1_const_array(Context *ctx, const ConstantsList *clist,
                                  int base, int size)
{
    char varname[64];
    get_ARB1_const_array_varname_in_buf(ctx, base, size, varname, sizeof (varname));
    int i;

    push_output(ctx, &ctx->globals);
    output_line(ctx, "PARAM %s[%d] = {", varname, size);
    ctx->indent++;

    for (i = 0; i < size; i++)
    {
        while (clist->constant.type != MOJOSHADER_UNIFORM_FLOAT)
            clist = clist->next;
        assert(clist->constant.index == (base + i));

        char val0[32];
        char val1[32];
        char val2[32];
        char val3[32];
        floatstr(ctx, val0, sizeof (val0), clist->constant.value.f[0], 1);
        floatstr(ctx, val1, sizeof (val1), clist->constant.value.f[1], 1);
        floatstr(ctx, val2, sizeof (val2), clist->constant.value.f[2], 1);
        floatstr(ctx, val3, sizeof (val3), clist->constant.value.f[3], 1);

        output_line(ctx, "{ %s, %s, %s, %s }%s", val0, val1, val2, val3,
                    (i < (size-1)) ? "," : "");

        clist = clist->next;
    } // for

    ctx->indent--;
    output_line(ctx, "};");
    pop_output(ctx);
}